

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyb_gga_xc_hse.c
# Opt level: O0

void hse03_set_ext_params(xc_func_type *p,double *ext_params)

{
  xc_func_type *in_RSI;
  xc_func_type *in_RDI;
  char *name;
  double par;
  double omega_PBE;
  double omega_HF;
  double beta;
  
  name = (char *)get_ext_param(in_RDI,(double *)in_RSI,0);
  par = get_ext_param(in_RDI,(double *)in_RSI,1);
  get_ext_param(in_RDI,(double *)in_RSI,2);
  in_RDI->mix_coef[1] = -(double)name;
  in_RDI->cam_beta = (double)name;
  in_RDI->cam_omega = par;
  xc_func_set_ext_params_name(in_RSI,name,par);
  xc_func_set_ext_params_name(in_RSI,name,par);
  return;
}

Assistant:

static void
hse03_set_ext_params(xc_func_type *p, const double *ext_params)
{
  double beta, omega_HF, omega_PBE;

  assert(p != NULL);

  beta      = get_ext_param(p, ext_params, 0);
  omega_HF  = get_ext_param(p, ext_params, 1);
  omega_PBE = get_ext_param(p, ext_params, 2);

  p->mix_coef[1] = -beta;

  p->cam_beta  = beta;
  p->cam_omega = omega_HF;

  xc_func_set_ext_params_name(p->func_aux[0], "_omega", 0.0);
  xc_func_set_ext_params_name(p->func_aux[1], "_omega", omega_PBE);
}